

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node_instance.c
# Opt level: O0

apx_portConnectorChangeTable_t *
apx_nodeInstance_get_provide_port_connector_changes(apx_nodeInstance_t *self,_Bool auto_create)

{
  apx_portConnectorChangeTable_t *paVar1;
  _Bool auto_create_local;
  apx_nodeInstance_t *self_local;
  
  if ((self == (apx_nodeInstance_t *)0x0) || (self->num_provide_ports == 0)) {
    self_local = (apx_nodeInstance_t *)0x0;
  }
  else {
    if ((self->provide_port_changes == (apx_portConnectorChangeTable_t *)0x0) && (auto_create)) {
      paVar1 = apx_portConnectorChangeTable_new(self->num_provide_ports);
      self->provide_port_changes = paVar1;
      if ((self->provide_port_changes != (apx_portConnectorChangeTable_t *)0x0) &&
         (self->server != (apx_server_tag *)0x0)) {
        apx_server_insert_modified_node_instance(self->server,self);
      }
    }
    self_local = (apx_nodeInstance_t *)self->provide_port_changes;
  }
  return (apx_portConnectorChangeTable_t *)self_local;
}

Assistant:

apx_portConnectorChangeTable_t* apx_nodeInstance_get_provide_port_connector_changes(apx_nodeInstance_t* self, bool auto_create)
{
   if ((self != NULL) && (self->num_provide_ports > 0))
   {
      if ((self->provide_port_changes == NULL) && (auto_create))
      {
         self->provide_port_changes = apx_portConnectorChangeTable_new(self->num_provide_ports);
         if ((self->provide_port_changes != NULL) && (self->server != NULL))
         {
            apx_server_insert_modified_node_instance(self->server, self);
         }
      }
      return self->provide_port_changes;
   }
   return (apx_portConnectorChangeTable_t*)NULL;
}